

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O1

bool __thiscall
jsonrpccxx::JsonRpcServer::Add
          (JsonRpcServer *this,string *name,MethodHandle *callback,NamedParamMapping *mapping)

{
  bool bVar1;
  long lVar2;
  _Any_data _Stack_48;
  _Manager_type local_38;
  
  bVar1 = false;
  lVar2 = std::__cxx11::string::rfind((char *)name,0x152570,0);
  if (lVar2 != 0) {
    std::
    function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
    ::function((function<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                *)&_Stack_48,callback);
    bVar1 = Dispatcher::Add(&this->dispatcher,name,(MethodHandle *)&_Stack_48,mapping);
    if (local_38 != (code *)0x0) {
      (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
    }
  }
  return bVar1;
}

Assistant:

bool Add(const std::string &name, MethodHandle callback, const NamedParamMapping &mapping = NAMED_PARAM_MAPPING) {
      if (name.rfind("rpc.", 0) == 0)
        return false;
      return dispatcher.Add(name, callback, mapping);
    }